

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O3

vector<double,_std::allocator<double>_> * __thiscall
NEST::NESTcalc::xyResolution
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,NESTcalc *this,
          double xPos_mm,double yPos_mm,double A_top)

{
  double dVar1;
  undefined1 auVar2 [16];
  double __x;
  double dVar3;
  undefined1 (*pauVar4) [16];
  RandomGen *pRVar5;
  value_type *__val;
  ulong uVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  double dVar10;
  undefined4 local_48;
  void *local_30 [2];
  long local_20;
  
  pauVar4 = (undefined1 (*) [16])operator_new(0x10);
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)pauVar4;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(pauVar4 + 1);
  *(undefined8 *)*pauVar4 = 0;
  *(undefined8 *)(*pauVar4 + 8) = 0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)(pauVar4 + 1);
  local_48 = SUB84(xPos_mm,0);
  (*this->fdetector->_vptr_VDetector[7])(local_48,yPos_mm,this->fdetector->TopDrift * 0.5,local_30);
  __x = (1.0 - *(double *)((long)local_30[0] + 8)) * A_top;
  operator_delete(local_30[0],local_20 - (long)local_30[0]);
  dVar7 = SQRT(yPos_mm * yPos_mm + xPos_mm * xPos_mm);
  dVar1 = this->fdetector->PosResBase;
  dVar10 = exp(this->fdetector->PosResExp * dVar7);
  if (__x < 0.0) {
    dVar8 = sqrt(__x);
  }
  else {
    dVar8 = SQRT(__x);
  }
  pRVar5 = RandomGen::rndm();
  dVar3 = RandomGen::rand_uniform(pRVar5);
  pRVar5 = RandomGen::rndm();
  uVar6 = -(ulong)(150.0 < dVar7);
  dVar8 = (double)(uVar6 & 0x405d000000000000 | ~uVar6 & (ulong)(dVar1 + dVar10)) / dVar8;
  dVar1 = RandomGen::rand_gauss(pRVar5,0.0,SQRT(dVar8 * dVar8 + 9.0),false);
  auVar9._0_8_ = ABS(dVar1);
  dVar10 = cos(dVar3 * 6.283185307179586);
  dVar7 = sin(dVar3 * 6.283185307179586);
  auVar9._8_4_ = SUB84(auVar9._0_8_,0);
  auVar9._12_4_ = (int)((ulong)auVar9._0_8_ >> 0x20);
  dVar10 = dVar10 * auVar9._0_8_;
  dVar7 = dVar7 * auVar9._8_8_;
  if (((((100.0 < auVar9._0_8_) || (dVar1 == 0.0)) || (100.0 < ABS(dVar10))) || (100.0 < ABS(dVar7))
      ) && (40.0 < __x)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "WARNING: your position resolution is worse than 10 cm. Is that correct?!",0x48);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Setting resolution to perfect, for the current event.",0x35);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    dVar10 = 0.0;
    dVar7 = 0.0;
  }
  auVar2._8_4_ = SUB84(yPos_mm + dVar7,0);
  auVar2._0_8_ = xPos_mm + dVar10;
  auVar2._12_4_ = (int)((ulong)(yPos_mm + dVar7) >> 0x20);
  *pauVar4 = auVar2;
  return __return_storage_ptr__;
}

Assistant:

vector<double> NESTcalc::xyResolution(double xPos_mm, double yPos_mm,
                                      double A_top) {
  vector<double> xySmeared(2);
  A_top *= 1. - fdetector->FitTBA(xPos_mm, yPos_mm,
                                  fdetector->get_TopDrift() / 2.)[1];

  double rad = sqrt(pow(xPos_mm, 2.) + pow(yPos_mm, 2.));
  double kappa = fdetector->get_PosResBase() +
                 exp(fdetector->get_PosResExp() * rad);  // arXiv:1710.02752
  if (rad > 150.)
    kappa = 116.;  // see git issue #131 from Claudio: but, converted from cm to
                   // mm here
  double sigmaR = kappa / sqrt(A_top);  // ibid. But only stat; add syst (~3mm)
  sigmaR = sqrt(sigmaR * sigmaR +
                9.);  // σ_vertex^2 = ((r_vertex/r_S2)*σ_(x,y))^2 + σ_sys^2

  double phi = two_PI * RandomGen::rndm()->rand_uniform();
  sigmaR = std::abs(RandomGen::rndm()->rand_gauss(0.0, sigmaR, false));
  double sigmaX = sigmaR * cos(phi);
  double sigmaY = sigmaR * sin(phi);

  if (sigmaR > 1e2 || std::isnan(sigmaR) || sigmaR <= 0. ||
      std::abs(sigmaX) > 1e2 || std::abs(sigmaY) > 1e2) {
    if (A_top >
        40.) {  // roughly three S2 e-'s in most detectors (or ~1.5 in LZ)
      cerr << "WARNING: your position resolution is worse than 10 cm. Is that "
              "correct?!"
           << endl;
      cerr << "Setting resolution to perfect, for the current event." << endl;
      sigmaX = 0.;
      sigmaY = 0.;
    }  // this is only a problem if the area is large and the res is still bad
  }

  xySmeared[0] = xPos_mm + sigmaX;
  xySmeared[1] = yPos_mm + sigmaY;

  return xySmeared;  // new X and Y position in mm with empirical smearing. LUX
                     // Run03 example
}